

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeFont(ImFont *font)

{
  ushort uVar1;
  ImGuiWindow *pIVar2;
  ImFontConfig *pIVar3;
  ImDrawList *this;
  undefined4 uVar4;
  undefined4 uVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  ImFontGlyph *pIVar9;
  ImU32 col;
  uint uVar10;
  ImWchar c;
  char *pcVar11;
  uint n;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint base;
  uint c_begin;
  void *ptr_id;
  float fVar15;
  ImVec2 cell_p1;
  ImVec2 cell_p2;
  char c_str [5];
  ImVec2 local_88;
  float fStack_80;
  float fStack_7c;
  float local_74;
  ImU32 local_70;
  float local_6c;
  ImVec2 local_68;
  char local_5d [5];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pcVar11 = "";
  if (font->ConfigData != (ImFontConfig *)0x0) {
    pcVar11 = font->ConfigData->Name;
  }
  bVar7 = TreeNode(font,"Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
                   SUB84((double)font->FontSize,0),pcVar11,(ulong)(uint)(font->Glyphs).Size,
                   (ulong)(uint)(int)font->ConfigDataCount);
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar6->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  bVar8 = SmallButton("Set as default");
  if (bVar8) {
    if (GImGui == (ImGuiContext *)0x0) {
      __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0xdd6,"ImGuiIO &ImGui::GetIO()");
    }
    (GImGui->IO).FontDefault = font;
  }
  if (bVar7) {
    PushFont(font);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();
    pIVar6 = GImGui;
    fVar15 = GImGui->FontSize;
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar6->NextItemData).Width = fVar15 * 8.0;
    DragFloat("Font scale",&font->Scale,0.005,0.3,2.0,"%.1f",0);
    pIVar6 = GImGui;
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->WriteAccessed = true;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar6->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    }
    MetricsHelpMarker(
                     "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)"
                     );
    Text("Ascent: %f, Descent: %f, Height: %f",SUB84((double)font->Ascent,0),(double)font->Descent,
         (double)(font->Ascent - font->Descent));
    uVar1 = font->FallbackChar;
    ImTextCharToUtf8(local_5d,(uint)uVar1);
    Text("Fallback character: \'%s\' (U+%04X)",local_5d,(ulong)(uint)uVar1);
    uVar1 = font->EllipsisChar;
    ImTextCharToUtf8(local_5d,(uint)uVar1);
    Text("Ellipsis character: \'%s\' (U+%04X)",local_5d,(ulong)(uint)uVar1);
    fVar15 = (float)font->MetricsTotalSurface;
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      fVar15 = SQRT(fVar15);
    }
    Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)font->MetricsTotalSurface,
         (ulong)(uint)(int)fVar15);
    if (0 < font->ConfigDataCount) {
      lVar13 = 0x56;
      uVar14 = 0;
      do {
        pIVar3 = font->ConfigData;
        if (pIVar3 != (ImFontConfig *)0x0) {
          BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                     SUB84((double)*(float *)(pIVar3->Name + lVar13 + -0x80),0),
                     (double)*(float *)(pIVar3->Name + lVar13 + -0x7c),uVar14 & 0xffffffff,
                     pIVar3->Name + lVar13 + -0x56,(ulong)*(uint *)((long)pIVar3 + lVar13 + -0x3e),
                     (ulong)*(uint *)((long)pIVar3 + lVar13 + -0x3a),
                     (ulong)*(byte *)((long)pIVar3 + lVar13 + -0x36));
        }
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x88;
      } while ((long)uVar14 < (long)font->ConfigDataCount);
    }
    bVar7 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(font->Glyphs).Size);
    pIVar6 = GImGui;
    if (bVar7) {
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      this = pIVar2->DrawList;
      local_88.x = (pIVar6->Style).Colors[0].x;
      local_88.y = (pIVar6->Style).Colors[0].y;
      uVar4 = (pIVar6->Style).Colors[0].z;
      uVar5 = (pIVar6->Style).Colors[0].w;
      fStack_7c = (pIVar6->Style).Alpha * (float)uVar5;
      fStack_80 = (float)uVar4;
      local_70 = ColorConvertFloat4ToU32((ImVec4 *)&local_88);
      if (pIVar6 == (ImGuiContext *)0x0) {
        __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x9c5,"ImGuiStyle &ImGui::GetStyle()");
      }
      fVar15 = font->FontSize;
      local_6c = (pIVar6->Style).ItemSpacing.y + fVar15;
      local_74 = local_6c * 16.0;
      ptr_id = (void *)0x0;
      do {
        c_begin = (uint)ptr_id;
        if (((ulong)ptr_id & 0xfff) == 0) {
          bVar7 = ImFont::IsGlyphRangeUnused(font,c_begin,c_begin | 0xfff);
          if (!bVar7) goto LAB_0014ab51;
          c_begin = c_begin | 0xf00;
        }
        else {
LAB_0014ab51:
          iVar12 = 0;
          uVar10 = 0;
          do {
            pIVar9 = ImFont::FindGlyphNoFallback(font,(short)ptr_id + (short)iVar12);
            uVar10 = (uVar10 + 1) - (uint)(pIVar9 == (ImFontGlyph *)0x0);
            iVar12 = iVar12 + 1;
          } while (iVar12 != 0x100);
          if (uVar10 != 0) {
            pcVar11 = "glyphs";
            if (uVar10 == 1) {
              pcVar11 = "glyph";
            }
            bVar7 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",ptr_id,(ulong)(c_begin + 0xff),
                             (ulong)uVar10,pcVar11);
            if (bVar7) {
              local_48 = (GImGui->CurrentWindow->DC).CursorPos;
              local_58 = local_48.y;
              uStack_40 = 0;
              uVar14 = 0;
              fStack_54 = local_58;
              fStack_50 = local_58;
              fStack_4c = local_58;
              do {
                uVar10 = (uint)uVar14;
                local_88.x = (float)(uVar10 & 0xf) * local_6c + local_48.x;
                local_88.y = (float)(int)(uVar14 >> 4) * local_6c + local_58;
                local_68.x = local_88.x + fVar15;
                local_68.y = local_88.y + fVar15;
                c = (ImWchar)(c_begin + uVar10);
                pIVar9 = ImFont::FindGlyphNoFallback(font,c);
                col = 0x64ffffff;
                if (pIVar9 == (ImFontGlyph *)0x0) {
                  col = 0x32ffffff;
                }
                ImDrawList::AddRect(this,&local_88,&local_68,col,0.0,0,1.0);
                if (pIVar9 != (ImFontGlyph *)0x0) {
                  ImFont::RenderChar(font,this,fVar15,local_88,local_70,c);
                  bVar7 = IsMouseHoveringRect(&local_88,&local_68,true);
                  if (bVar7) {
                    BeginTooltipEx(0,0);
                    Text("Codepoint: U+%04X",(ulong)(c_begin + uVar10));
                    Separator();
                    Text("Visible: %d",(ulong)(*(uint *)pIVar9 >> 1 & 1));
                    Text("AdvanceX: %.1f",SUB84((double)pIVar9->AdvanceX,0));
                    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",SUB84((double)pIVar9->X0,0),
                         (double)pIVar9->Y0,(double)pIVar9->X1,(double)pIVar9->Y1);
                    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",SUB84((double)pIVar9->U0,0),
                         (double)pIVar9->V0,(double)pIVar9->U1,(double)pIVar9->V1);
                    EndTooltip();
                  }
                }
                uVar14 = (ulong)(uVar10 + 1);
              } while (uVar10 + 1 != 0x100);
              local_88.y = local_74;
              local_88.x = local_74;
              Dummy(&local_88);
              TreePop();
            }
          }
        }
        ptr_id = (void *)(ulong)(c_begin + 0x100);
      } while (c_begin + 0x100 < 0x10000);
      TreePop();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeFont(ImFont* font)
{
    bool opened = TreeNode(font, "Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
        font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
    SameLine();
    if (SmallButton("Set as default"))
        GetIO().FontDefault = font;
    if (!opened)
        return;

    // Display preview text
    PushFont(font);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();

    // Display details
    SetNextItemWidth(GetFontSize() * 8);
    DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");
    SameLine(); MetricsHelpMarker(
        "Note than the default embedded font is NOT meant to be scaled.\n\n"
        "Font are currently rendered into bitmaps at a given size at the time of building the atlas. "
        "You may oversample them to get some flexibility with scaling. "
        "You can also render at multiple sizes and select which one to use at runtime.\n\n"
        "(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)");
    Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
    char c_str[5];
    Text("Fallback character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->FallbackChar), font->FallbackChar);
    Text("Ellipsis character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->EllipsisChar), font->EllipsisChar);
    const int surface_sqrt = (int)ImSqrt((float)font->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, surface_sqrt, surface_sqrt);
    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
        if (font->ConfigData)
            if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                    config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH, cfg->GlyphOffset.x, cfg->GlyphOffset.y);

    // Display all glyphs of the fonts in separate pages of 256 characters
    if (TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
    {
        ImDrawList* draw_list = GetWindowDrawList();
        const ImU32 glyph_col = GetColorU32(ImGuiCol_Text);
        const float cell_size = font->FontSize * 1;
        const float cell_spacing = GetStyle().ItemSpacing.y;
        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
        {
            // Skip ahead if a large bunch of glyphs are not present in the font (test in chunks of 4k)
            // This is only a small optimization to reduce the number of iterations when IM_UNICODE_MAX_CODEPOINT
            // is large // (if ImWchar==ImWchar32 we will do at least about 272 queries here)
            if (!(base & 4095) && font->IsGlyphRangeUnused(base, base + 4095))
            {
                base += 4096 - 256;
                continue;
            }

            int count = 0;
            for (unsigned int n = 0; n < 256; n++)
                if (font->FindGlyphNoFallback((ImWchar)(base + n)))
                    count++;
            if (count <= 0)
                continue;
            if (!TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                continue;

            // Draw a 16x16 grid of glyphs
            ImVec2 base_pos = GetCursorScreenPos();
            for (unsigned int n = 0; n < 256; n++)
            {
                // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions
                // available here and thus cannot easily generate a zero-terminated UTF-8 encoded string.
                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                if (glyph)
                    font->RenderChar(draw_list, cell_size, cell_p1, glyph_col, (ImWchar)(base + n));
                if (glyph && IsMouseHoveringRect(cell_p1, cell_p2))
                {
                    BeginTooltip();
                    Text("Codepoint: U+%04X", base + n);
                    Separator();
                    Text("Visible: %d", glyph->Visible);
                    Text("AdvanceX: %.1f", glyph->AdvanceX);
                    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                    EndTooltip();
                }
            }
            Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
            TreePop();
        }
        TreePop();
    }
    TreePop();
}